

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O1

void __thiscall
Rml::ControlledLifetimeResource<Rml::ElementMetaPool>::Initialize
          (ControlledLifetimeResource<Rml::ElementMetaPool> *this)

{
  code *pcVar1;
  bool bVar2;
  Pool<Rml::ElementMeta> *this_00;
  
  if (this->pointer != (ElementMetaPool *)0x0) {
    bVar2 = Assert("Resource already initialized.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x2e);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  this_00 = (Pool<Rml::ElementMeta> *)operator_new(0x28);
  this_00->chunk_size = 0;
  this_00->grow = false;
  *(undefined3 *)&this_00->field_0x5 = 0;
  this_00->pool = (PoolChunk *)0x0;
  this_00->first_allocated_node = (PoolNode *)0x0;
  this_00->first_free_node = (PoolNode *)0x0;
  this_00->num_allocated_objects = 0;
  this_00->max_num_allocated_objects = 0;
  this_00->grow = true;
  this_00->chunk_size = 0x32;
  this_00->pool = (PoolChunk *)0x0;
  Pool<Rml::ElementMeta>::CreateChunk(this_00);
  this->pointer = (ElementMetaPool *)this_00;
  return;
}

Assistant:

void Initialize()
	{
		RMLUI_ASSERTMSG(!pointer, "Resource already initialized.");
		pointer = new T();
	}